

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void dsfmt_fill_array_close1_open2(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  w128_t *pwVar7;
  long lVar8;
  ulong uVar9;
  w128_t *pwVar10;
  uint uVar11;
  bool bVar12;
  w128_t local_48;
  w128_t *local_38;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x1f8,"void dsfmt_fill_array_close1_open2(dsfmt_t *, double *, int)");
  }
  if (0x17d < size) {
    local_38 = dsfmt->status + 0xbf;
    local_48.u[0] = dsfmt->status[0xbf].u[0];
    local_48.u[1] = *(uint64_t *)((long)dsfmt->status + 0xbf8);
    do_recursion((w128_t *)array,dsfmt->status,dsfmt->status + 0x75,&local_48);
    pwVar10 = dsfmt->status + 0x76;
    for (lVar8 = 0; lVar8 != 0x490; lVar8 = lVar8 + 0x10) {
      do_recursion((w128_t *)((long)array + lVar8 + 0x10),pwVar10 + -0x75,pwVar10,&local_48);
      pwVar10 = pwVar10 + 1;
    }
    pwVar10 = dsfmt->status + 0x4a;
    lVar8 = 0x75;
    pwVar7 = (w128_t *)array;
    while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
      do_recursion(pwVar7 + 0x4a,pwVar10,pwVar7,&local_48);
      pwVar10 = pwVar10 + 1;
      pwVar7 = pwVar7 + 1;
    }
    uVar11 = (uint)size >> 1;
    pwVar10 = (w128_t *)(array + 0x17e);
    for (uVar9 = 0xbf; (long)uVar9 < (long)(int)(uVar11 - 0xbf); uVar9 = uVar9 + 1) {
      do_recursion(pwVar10,pwVar10 + -0xbf,pwVar10 + -0x4a,&local_48);
      pwVar10 = pwVar10 + 1;
    }
    uVar6 = 0;
    uVar5 = (ulong)(0x17e - uVar11);
    if ((int)(0x17e - uVar11) < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
      puVar1 = (undefined8 *)((long)array + uVar6 + (ulong)uVar11 * 0x10 + -0xbf0);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + uVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
    }
    pwVar7 = dsfmt->status + uVar5;
    for (; uVar9 < uVar11; uVar9 = uVar9 + 1) {
      do_recursion(pwVar10,pwVar10 + -0xbf,pwVar10 + -0x4a,&local_48);
      uVar4 = pwVar10->u[1];
      pwVar7->u[0] = pwVar10->u[0];
      pwVar7->u[1] = uVar4;
      pwVar7 = (w128_t *)(pwVar7->u + 2);
      pwVar10 = pwVar10 + 1;
    }
    local_38->u[0] = local_48.u[0];
    local_38->u[1] = local_48.u[1];
    return;
  }
  __assert_fail("size >= DSFMT_N64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                ,0x1f9,"void dsfmt_fill_array_close1_open2(dsfmt_t *, double *, int)");
}

Assistant:

void dsfmt_fill_array_close1_open2(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c1o2(dsfmt, (w128_t *)array, size / 2);
}